

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ict.cpp
# Opt level: O3

Procedure * __thiscall Canonicalizer::visit(Canonicalizer *this,Procedure *fragment)

{
  StmNode *pSVar1;
  Fragment *pFVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  pSVar1 = fragment->body;
  if (pSVar1 != (StmNode *)0x0) {
    iVar3 = (*(pSVar1->super_ICTNode)._vptr_ICTNode[3])(pSVar1,this);
    Procedure::setBody(fragment,(StmNode *)CONCAT44(extraout_var,iVar3));
  }
  pFVar2 = (fragment->super_Fragment).next;
  if (pFVar2 != (Fragment *)0x0) {
    iVar3 = (*pFVar2->_vptr_Fragment[3])(pFVar2,this);
    (fragment->super_Fragment).next = (Fragment *)CONCAT44(extraout_var_00,iVar3);
  }
  return fragment;
}

Assistant:

Procedure *Canonicalizer::visit(Procedure *fragment) {
    if (fragment->getBody() != nullptr) {
        fragment->setBody(fragment->getBody()->accept(this));
    }
    if (fragment->getNext() != nullptr) {
        fragment->setNext(fragment->getNext()->accept(this));
    }
    return fragment;
}